

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF.h
# Opt level: O0

char * Assimp::IFF::ReadHeader(uint8_t *outFile,uint32_t *fileType)

{
  ChunkHeader CVar1;
  uint32_t local_28;
  ChunkHeader head;
  uint32_t *fileType_local;
  uint8_t *outFile_local;
  
  fileType_local = (uint32_t *)outFile;
  CVar1 = LoadChunk((uint8_t **)&fileType_local);
  local_28 = CVar1.type;
  if (local_28 == 0x464f524d) {
    *fileType = *fileType_local;
    ByteSwap::Swap4(fileType);
    outFile_local = (uint8_t *)0x0;
  }
  else {
    outFile_local = "The file is not an IFF file: FORM chunk is missing";
  }
  return (char *)outFile_local;
}

Assistant:

inline const char* ReadHeader(uint8_t* outFile, uint32_t& fileType)
{
    ChunkHeader head = LoadChunk(outFile);
    if(AI_IFF_FOURCC_FORM != head.type)
    {
        return "The file is not an IFF file: FORM chunk is missing";
    }
    ::memcpy(&fileType, outFile, 4);
    AI_LSWAP4(fileType);
    return 0;
}